

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::
     outer_product_selector_run<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>const>,2>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,1,false>,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>const>,2>::sub>
               (GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_2>
                *prod,Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>
                      *dest,sub *func,false_type *param_4)

{
  Index IVar1;
  Index in_RDX;
  ProductBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_2>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_RDI;
  Index j;
  Index cols;
  Index rowId;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_ffffffffffffff30;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>_>
  *in_stack_ffffffffffffff38;
  sub *in_stack_ffffffffffffff40;
  undefined8 local_30;
  
  IVar1 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_false>,_0>
          ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
                  *)0x310c54);
  for (local_30 = 0; local_30 < IVar1; local_30 = local_30 + 1) {
    rowId = in_RDX;
    DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_false>_>
    ::col(in_stack_ffffffffffffff38,(Index)in_stack_ffffffffffffff30);
    ProductBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_2>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::rhs(in_RDI);
    in_stack_ffffffffffffff30 =
         (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
          *)TransposeImpl<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Dense>::coeff
                      ((TransposeImpl<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Dense> *)
                       in_stack_ffffffffffffff30,rowId,0x310cc5);
    ProductBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_2>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::lhs(in_RDI);
    Eigen::operator*((Scalar *)in_stack_ffffffffffffff38,
                     (StorageBaseType *)in_stack_ffffffffffffff30);
    GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,2,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>const>,2>
    ::sub::operator()(in_stack_ffffffffffffff40,
                      (Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,__1,_1,_true>
                       *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void outer_product_selector_run(const ProductType& prod, Dest& dest, const Func& func, const false_type&)
{
  typedef typename Dest::Index Index;
  // FIXME make sure lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dest.cols();
  for (Index j=0; j<cols; ++j)
    func(dest.col(j), prod.rhs().coeff(0,j) * prod.lhs());
}